

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O2

void Util::Eigen2csv(string *file,MatrixXd *mat)

{
  uint uVar1;
  int iVar2;
  char cVar3;
  ostream *poVar4;
  ulong uVar5;
  int ii;
  ulong uVar6;
  ulong uVar7;
  int jj;
  ulong uVar8;
  ofstream f;
  undefined8 auStack_228 [2];
  uint auStack_218 [122];
  
  uVar1 = (uint)(mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_rows;
  uVar7 = (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  std::ofstream::ofstream((string *)&f);
  std::ofstream::open((string *)&f,(_Ios_Openmode)file);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    poVar4 = std::operator<<((ostream *)&std::cout,"Error: Unable to open file!");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  *(uint *)((long)auStack_218 + *(long *)(_f + -0x18)) =
       *(uint *)((long)auStack_218 + *(long *)(_f + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)auStack_228 + *(long *)(_f + -0x18)) = 0x11;
  iVar2 = (int)uVar7;
  uVar6 = 0;
  uVar7 = uVar7 & 0xffffffff;
  if (iVar2 < 1) {
    uVar7 = uVar6;
  }
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      std::ostream::_M_insert<double>
                ((mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data[(mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_rows * uVar8 + uVar6]);
      if (iVar2 - 1 != uVar8) {
        std::operator<<((ostream *)&f,", ");
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&f);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&f);
  return;
}

Assistant:

void Eigen2csv(std::string file, Eigen::MatrixXd mat){

		//locals
		int height = mat.rows();
		int width = mat.cols();

		//open file
		std::ofstream f;
		f.open(file);
		if(!f.is_open()){
			std::cout << "Error: Unable to open file!" << std::endl;
		}

		//set precision
		f << std::fixed << std::setprecision(17);

		//write
		for (int ii = 0; ii < height; ++ii) {
			for (int jj = 0; jj < width; ++jj) {
			
				// write element
				f << mat(ii,jj);

				//write comma
				if(jj != (width-1)){
					f << ", ";
				}

			}

			//newline
			f << std::endl;
		}

		f.close();


	}